

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O3

Vec_Bit_t * Gia_ManGenUsed(Gia_Man_t *p,int fBuf)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  Vec_Bit_t *pVVar5;
  byte *__s;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  Gia_Obj_t *pGVar10;
  int iVar11;
  int iVar12;
  size_t __size;
  uint uVar13;
  
  uVar1 = p->nObjs;
  iVar12 = (((int)uVar1 >> 5) + 1) - (uint)((uVar1 & 0x1f) == 0);
  pVVar5 = (Vec_Bit_t *)malloc(0x10);
  uVar13 = iVar12 * 0x20;
  pVVar5->nCap = uVar13;
  if (iVar12 == 0) {
    __size = 0;
    __s = (byte *)0x0;
  }
  else {
    __size = (long)iVar12 << 2;
    __s = (byte *)malloc(__size);
  }
  pVVar5->pArray = (int *)__s;
  pVVar5->nSize = uVar13;
  memset(__s,0,__size);
  if ((0 < (int)uVar1) && (pGVar10 = p->pObjs, pGVar10 != (Gia_Obj_t *)0x0)) {
    uVar6 = 0;
    do {
      uVar9 = *(ulong *)pGVar10;
      if ((~(uint)uVar9 & 0x1fffffff) != 0 && -1 < (int)(uint)uVar9) {
        if (fBuf != 0) {
          if (uVar13 <= uVar6) goto LAB_0021b3ac;
          *(uint *)(__s + (uVar6 >> 5 & 0x7ffffff) * 4) =
               *(uint *)(__s + (uVar6 >> 5 & 0x7ffffff) * 4) | 1 << ((byte)uVar6 & 0x1f);
          uVar9 = *(ulong *)pGVar10;
        }
        if (((uint)(uVar9 >> 0x1d) & 1) != fBuf) {
          lVar8 = -((uint)uVar9 & 0x1fffffff) + uVar6;
          uVar7 = (uint)lVar8;
          if (((int)uVar7 < 0) || ((int)uVar13 <= (int)uVar7)) goto LAB_0021b3ac;
          *(uint *)(__s + (ulong)(uVar7 >> 5) * 4) =
               *(uint *)(__s + (ulong)(uVar7 >> 5) * 4) | 1 << ((byte)lVar8 & 0x1f);
          uVar9 = *(ulong *)pGVar10;
        }
        uVar7 = (uint)(uVar9 >> 0x20);
        if ((uVar7 >> 0x1d & 1) != fBuf) {
          lVar8 = -(uVar7 & 0x1fffffff) + uVar6;
          uVar7 = (uint)lVar8;
          if (((int)uVar7 < 0) || ((int)uVar13 <= (int)uVar7)) goto LAB_0021b3ac;
          *(uint *)(__s + (ulong)(uVar7 >> 5) * 4) =
               *(uint *)(__s + (ulong)(uVar7 >> 5) * 4) | 1 << ((byte)lVar8 & 0x1f);
        }
      }
      uVar6 = uVar6 + 1;
      pGVar10 = pGVar10 + 1;
    } while (uVar1 != uVar6);
  }
  pVVar3 = p->vCos;
  iVar11 = pVVar3->nSize;
  if (0 < iVar11) {
    piVar4 = pVVar3->pArray;
    lVar8 = 0;
    while( true ) {
      iVar2 = piVar4[lVar8];
      if (((long)iVar2 < 0) || ((int)uVar1 <= iVar2)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar7 = *(uint *)(p->pObjs + iVar2);
      if ((uVar7 >> 0x1d & 1) != fBuf) {
        uVar7 = iVar2 - (uVar7 & 0x1fffffff);
        if (((int)uVar7 < 0) || ((int)uVar13 <= (int)uVar7)) goto LAB_0021b3ac;
        *(uint *)(__s + (ulong)(uVar7 >> 5) * 4) =
             *(uint *)(__s + (ulong)(uVar7 >> 5) * 4) | 1 << ((byte)uVar7 & 0x1f);
        iVar11 = pVVar3->nSize;
      }
      lVar8 = lVar8 + 1;
      if (iVar11 <= lVar8) break;
    }
  }
  if (0 < iVar12) {
    *__s = *__s & 0xfe;
    return pVVar5;
  }
LAB_0021b3ac:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
}

Assistant:

Vec_Bit_t * Gia_ManGenUsed( Gia_Man_t * p, int fBuf )
{
    Gia_Obj_t * pObj; int i;
    Vec_Bit_t * vUsed = Vec_BitStart( Gia_ManObjNum(p) );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( fBuf )
            Vec_BitWriteEntry( vUsed, i, 1 );
        if ( Gia_ObjFaninC0(pObj) ^ fBuf )
            Vec_BitWriteEntry( vUsed, Gia_ObjFaninId0(pObj, i), 1 );
        if ( Gia_ObjFaninC1(pObj) ^ fBuf )
            Vec_BitWriteEntry( vUsed, Gia_ObjFaninId1(pObj, i), 1 );
    }
    Gia_ManForEachCo( p, pObj, i )
        if ( Gia_ObjFaninC0(pObj) ^ fBuf )
            Vec_BitWriteEntry( vUsed, Gia_ObjFaninId0p(p, pObj), 1 );
    Vec_BitWriteEntry( vUsed, 0, 0 ); // clean zero
    return vUsed;
}